

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

string * __thiscall
testing::internal::String::FormatHexUInt32_abi_cxx11_
          (string *__return_storage_ptr__,String *this,uint32_t value)

{
  stringstream local_1a0 [8];
  stringstream ss;
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  *(uint *)(&ss.field_0x20 + *(long *)(ss._8_8_ + -0x18)) =
       *(uint *)(&ss.field_0x20 + *(long *)(ss._8_8_ + -0x18)) & 0xffffffb5 | 8;
  *(uint *)(&ss.field_0x20 + *(long *)(ss._8_8_ + -0x18)) =
       *(uint *)(&ss.field_0x20 + *(long *)(ss._8_8_ + -0x18)) | 0x4000;
  std::ostream::_M_insert<unsigned_long>((ulong)&ss.field_0x8);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  std::ios_base::~ios_base((ios_base *)&ss.field_0x78);
  return __return_storage_ptr__;
}

Assistant:

std::string String::FormatHexUInt32(uint32_t value) {
  std::stringstream ss;
  ss << std::hex << std::uppercase << value;
  return ss.str();
}